

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_framebuffer.cpp
# Opt level: O0

void __thiscall OpenGLFrameBuffer::DoSetGamma(OpenGLFrameBuffer *this)

{
  undefined2 uVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  byte local_65a;
  byte local_659;
  byte local_649;
  double local_648;
  double val;
  int i;
  double norm;
  double invgamma;
  float bright;
  float contrast;
  float gamma;
  WORD gammaTable [768];
  bool useHWGamma;
  OpenGLFrameBuffer *this_local;
  
  local_649 = 0;
  if (((this->super_SDLGLFB).m_supportsGamma & 1U) != 0) {
    iVar2 = FIntCVar::operator_cast_to_int(&vid_hwgamma);
    local_659 = 1;
    if (iVar2 != 0) {
      iVar2 = FIntCVar::operator_cast_to_int(&vid_hwgamma);
      local_65a = 0;
      if (iVar2 == 2) {
        iVar2 = (*(this->super_SDLGLFB).super_DFrameBuffer.super_DSimpleCanvas.super_DCanvas.
                  super_DObject._vptr_DObject[0x21])();
        local_65a = (byte)iVar2;
      }
      local_659 = local_65a;
    }
    local_649 = local_659;
  }
  gammaTable[0x2ff]._1_1_ = local_649 & 1;
  if (gammaTable[0x2ff]._1_1_ == 0) {
    if ((this->HWGammaActive & 1U) != 0) {
      SDLGLFB::ResetGammaTable(&this->super_SDLGLFB);
      this->HWGammaActive = false;
    }
  }
  else {
    fVar3 = FFloatCVar::operator_cast_to_float(&Gamma);
    fVar3 = clamp<float>(fVar3,0.1,4.0);
    fVar4 = FFloatCVar::operator_cast_to_float(&vid_contrast);
    fVar4 = clamp<float>(fVar4,0.1,3.0);
    fVar5 = FFloatCVar::operator_cast_to_float(&vid_brightness);
    fVar5 = clamp<float>(fVar5,-0.8,0.8);
    dVar6 = pow(255.0,(double)(1.0 / fVar3) - 1.0);
    for (val._4_4_ = 0; val._4_4_ < 0x100; val._4_4_ = val._4_4_ + 1) {
      local_648 = (double)((float)val._4_4_ * fVar4 - (fVar4 - 1.0) * 127.0);
      if ((fVar3 != 1.0) || (NAN(fVar3))) {
        local_648 = pow(local_648,(double)(1.0 / fVar3));
        local_648 = local_648 / dVar6;
      }
      dVar7 = clamp<double>((local_648 + (double)(fVar5 * 128.0)) * 256.0,0.0,65535.0);
      uVar1 = (undefined2)(int)dVar7;
      *(undefined2 *)((long)&contrast + (long)(val._4_4_ + 0x200) * 2) = uVar1;
      *(undefined2 *)((long)&contrast + (long)(val._4_4_ + 0x100) * 2) = uVar1;
      *(undefined2 *)((long)&contrast + (long)val._4_4_ * 2) = uVar1;
    }
    SDLGLFB::SetGammaTable(&this->super_SDLGLFB,(WORD *)&contrast);
    this->HWGammaActive = true;
  }
  return;
}

Assistant:

void OpenGLFrameBuffer::DoSetGamma()
{
	bool useHWGamma = m_supportsGamma && ((vid_hwgamma == 0) || (vid_hwgamma == 2 && IsFullscreen()));
	if (useHWGamma)
	{
		WORD gammaTable[768];

		// This formula is taken from Doomsday
		float gamma = clamp<float>(Gamma, 0.1f, 4.f);
		float contrast = clamp<float>(vid_contrast, 0.1f, 3.f);
		float bright = clamp<float>(vid_brightness, -0.8f, 0.8f);

		double invgamma = 1 / gamma;
		double norm = pow(255., invgamma - 1);

		for (int i = 0; i < 256; i++)
		{
			double val = i * contrast - (contrast - 1) * 127;
			if(gamma != 1) val = pow(val, invgamma) / norm;
			val += bright * 128;

			gammaTable[i] = gammaTable[i + 256] = gammaTable[i + 512] = (WORD)clamp<double>(val*256, 0, 0xffff);
		}
		SetGammaTable(gammaTable);

		HWGammaActive = true;
	}
	else if (HWGammaActive)
	{
		ResetGammaTable();
		HWGammaActive = false;
	}
}